

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O3

Matcher<const_std::vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>_&>
* __thiscall
testing::PolymorphicMatcher::operator_cast_to_Matcher
          (Matcher<const_std::vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>_&>
           *__return_storage_ptr__,PolymorphicMatcher *this)

{
  undefined8 *puVar1;
  undefined4 *puVar2;
  
  puVar1 = (undefined8 *)operator_new(0x20);
  *puVar1 = &PTR__MonomorphicImpl_00238400;
  std::vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>::vector
            ((vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_> *)
             (puVar1 + 1),
             (vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_> *)
             this);
  (__return_storage_ptr__->
  super_MatcherBase<const_std::vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>_&>
  ).vtable_ = (VTable *)
              internal::
              MatcherBase<std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>const&>
              ::
              GetVTable<testing::internal::MatcherBase<std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>const&>::ValuePolicy<testing::MatcherInterface<std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>const&>const*,true>>()
              ::kVTable;
  puVar2 = (undefined4 *)operator_new(0x10);
  *puVar2 = 1;
  *(undefined8 **)(puVar2 + 2) = puVar1;
  (__return_storage_ptr__->
  super_MatcherBase<const_std::vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>_&>
  ).buffer_.ptr = puVar2;
  (__return_storage_ptr__->
  super_MatcherBase<const_std::vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>_&>
  ).super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00238468;
  return __return_storage_ptr__;
}

Assistant:

operator Matcher<T>() const {
    return Matcher<T>(new MonomorphicImpl<const T&>(impl_));
  }